

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit
          (BinBinaryReader *this,Pointer *value)

{
  ushort *puVar1;
  char *pcVar2;
  uint *pos;
  ushort *puVar3;
  BinCompat *pBVar4;
  char cVar5;
  bool bVar6;
  ssize_t sVar7;
  reference pvVar8;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  ulong uVar9;
  byte bVar10;
  Type type;
  bool local_53;
  Type local_52;
  byte local_51;
  ushort *local_50;
  ulong local_48;
  char *local_40;
  BinaryReader *local_38;
  
  local_38 = &this->reader;
  pcVar2 = (this->reader).cur_;
  sVar7 = BinaryReader::read(local_38,(int)value,in_RDX,in_RCX);
  if ((char)sVar7 == '\0') {
    local_53 = fail_msg(this,"reader.read(value.name)",pcVar2);
  }
  else if ((value->name).hash_ == 0) {
    local_53 = true;
  }
  else {
    pos = (uint *)(this->reader).cur_;
    if ((this->reader).cap_ < pos + 1) {
      local_48 = 0;
      local_53 = fail_msg(this,"reader.read(size)",(char *)pos);
    }
    else {
      local_48 = (ulong)*pos;
      (this->reader).cur_ = (char *)(pos + 1);
      local_50 = (ushort *)(this->reader).cur_;
      puVar1 = local_50 + 1;
      puVar3 = (ushort *)(this->reader).cap_;
      if (puVar3 < puVar1) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)*local_50;
        (this->reader).cur_ = (char *)puVar1;
      }
      local_40 = (this->reader).beg_;
      if (puVar3 < puVar1) {
        local_53 = fail_msg(this,"reader.read(count)",(char *)local_50);
      }
      else {
        bVar10 = uVar9 == 0;
        if (!(bool)bVar10) {
          do {
            local_51 = bVar10;
            pvVar8 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                               (&value->items);
            local_52 = NONE;
            pcVar2 = (this->reader).cur_;
            sVar7 = BinaryReader::read(local_38,(int)pvVar8,__buf,in_RCX);
            if ((char)sVar7 == '\0') {
              local_53 = fail_msg(this,"reader.read(name)",pcVar2);
LAB_001183e8:
              bVar6 = false;
            }
            else {
              pcVar2 = (this->reader).cur_;
              if ((this->reader).cap_ < pcVar2 + 1) {
                in_RCX = 0;
                cVar5 = '\0';
              }
              else {
                cVar5 = *pcVar2;
                in_RCX = CONCAT71((int7)(in_RCX >> 8),cVar5);
                (this->reader).cur_ = pcVar2 + 1;
                pBVar4 = (this->reader).compat_;
                cVar5 = (**(code **)(*(long *)pBVar4 + 0x10))(pBVar4,cVar5,&local_52);
              }
              if (cVar5 == '\0') {
                local_53 = fail_msg(this,"reader.read(type)",pcVar2);
                goto LAB_001183e8;
              }
              pcVar2 = (this->reader).cur_;
              bVar6 = read_value_of(this,&pvVar8->value,local_52);
              if (!bVar6) {
                local_53 = fail_msg(this,"read_value_of(item, type)",pcVar2);
              }
            }
            bVar10 = local_51;
            if (bVar6 == false) break;
            uVar9 = uVar9 - 1;
            bVar10 = uVar9 == 0;
          } while (!(bool)bVar10);
        }
        if (((bVar10 & 1) != 0) &&
           (local_53 = true,
           (long)(this->reader).cur_ - (long)(this->reader).beg_ !=
           (long)local_50 + (local_48 - (long)local_40))) {
          local_53 = fail_msg(this,"reader.position() == position + size",(this->reader).cur_);
        }
      }
    }
  }
  return (bool)(local_53 & 1);
}

Assistant:

bool read_value_visit(Pointer& value) noexcept {
            uint32_t size = 0;
            uint16_t count = 0;
            bin_assert(reader.read(value.name));
            if (value.name.hash() == 0) {
                return true;
            }
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = value.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }